

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::SkipSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,uint iType,uint iWidth,
          uint iHeight)

{
  uint iType_00;
  size_t sVar1;
  int32_t iMe;
  Material_MDL7 *pcMatIn;
  undefined1 local_468 [8];
  aiTexture tex;
  uint iSkip;
  size_t iLen;
  uint iMasked;
  uint iHeight_local;
  uint iWidth_local;
  uint iType_local;
  uchar **szCurrentOut_local;
  uchar *szCurrent_local;
  MDLImporter *this_local;
  
  iType_00 = iType & 0xf;
  szCurrentOut_local = (uchar **)szCurrent;
  if (iType_00 == 6) {
    szCurrentOut_local = (uchar **)(szCurrent + iWidth);
  }
  if (iType_00 == 7) {
    sVar1 = strlen((char *)szCurrentOut_local);
    szCurrentOut_local = (uchar **)(sVar1 + 1 + (long)szCurrentOut_local);
  }
  else if (((iType_00 != 0) || (iType == 0)) &&
          (((iType_00 != 0 || (iType == 0)) || (((iType != 0 && (iWidth != 0)) && (iHeight != 0)))))
          ) {
    tex._1060_4_ = 0;
    aiTexture::aiTexture((aiTexture *)local_468);
    tex.achFormatHint[8] = -1;
    tex._17_7_ = 0xffffffffffffff;
    local_468._0_4_ = iWidth;
    local_468._4_4_ = iHeight;
    ParseTextureColorData
              (this,(uchar *)szCurrentOut_local,iType_00,(uint *)&tex.field_0x424,
               (aiTexture *)local_468);
    tex.achFormatHint[8] = '\0';
    tex._17_7_ = 0;
    szCurrentOut_local = (uchar **)((long)szCurrentOut_local + (ulong)(uint)tex._1060_4_);
    aiTexture::~aiTexture((aiTexture *)local_468);
  }
  if ((iType & 0x10) != 0) {
    szCurrentOut_local = (uchar **)((long)szCurrentOut_local + 0x44);
  }
  if ((iType & 0x20) != 0) {
    szCurrentOut_local = (uchar **)((long)*(int *)szCurrentOut_local + 4 + (long)szCurrentOut_local)
    ;
  }
  *szCurrentOut = (uchar *)szCurrentOut_local;
  return;
}

Assistant:

void MDLImporter::SkipSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    // get the type of the skin
    const unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x6 == iMasked)
    {
        szCurrent += iWidth;
    }
    if (0x7 == iMasked)
    {
        const size_t iLen = ::strlen((const char*)szCurrent);
        szCurrent += iLen+1;
    }
    else if (iMasked || !iType)
    {
        if (iMasked || !iType || (iType && iWidth && iHeight))
        {
            // ParseTextureColorData(..., aiTexture::pcData == bad_texel) will simply
            // return the size of the color data in bytes in iSkip
            unsigned int iSkip = 0;

            aiTexture tex;
            tex.pcData = bad_texel;
            tex.mHeight = iHeight;
            tex.mWidth = iWidth;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,&tex);

            // FIX: Important, otherwise the destructor will crash
            tex.pcData = NULL;

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
    }

    // if an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
    }
    *szCurrentOut = szCurrent;
}